

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DefaultConfigRuleSyntax::setChild
          (DefaultConfigRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  ConfigLiblistSyntax *pCVar2;
  Token TVar3;
  
  if (index == 2) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->semi).kind = TVar3.kind;
    (this->semi).field_0x2 = TVar3._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->semi).rawLen = TVar3.rawLen;
    (this->semi).info = TVar3.info;
  }
  else if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pCVar2 = (ConfigLiblistSyntax *)0x0;
    }
    else {
      pCVar2 = (ConfigLiblistSyntax *)TokenOrSyntax::node(&child);
    }
    (this->liblist).ptr = pCVar2;
  }
  else {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->defaultKeyword).kind = TVar3.kind;
    (this->defaultKeyword).field_0x2 = TVar3._2_1_;
    (this->defaultKeyword).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->defaultKeyword).rawLen = TVar3.rawLen;
    (this->defaultKeyword).info = TVar3.info;
  }
  return;
}

Assistant:

void DefaultConfigRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: defaultKeyword = child.token(); return;
        case 1: liblist = child.node() ? &child.node()->as<ConfigLiblistSyntax>() : nullptr; return;
        case 2: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}